

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::UnsafeArenaSetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  int iVar1;
  Arena *pAVar2;
  btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
  *this_00;
  short sVar3;
  Extension *pEVar4;
  MessageLite *this_01;
  long lVar5;
  undefined7 in_register_00000011;
  undefined8 extraout_RDX;
  long lVar6;
  undefined1 *puVar7;
  ExtensionSet *this_02;
  ExtensionSet *pEVar8;
  ulong uVar9;
  ExtensionSet *const_this;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar10;
  int iStack_7c;
  ulong uStack_78;
  ExtensionSet EStack_70;
  ulong uStack_58;
  FieldDescriptor *pFStack_50;
  Extension *pEStack_48;
  ExtensionSet *pEStack_40;
  undefined1 auStack_38 [16];
  
  this_02 = (ExtensionSet *)auStack_38;
  puVar7 = auStack_38;
  if (message == (MessageLite *)0x0) {
    pEStack_40 = (ExtensionSet *)0x25a8a5;
    pEVar4 = FindOrNull(this,number);
    if (pEVar4 == (Extension *)0x0) {
      return;
    }
    Extension::Clear(pEVar4);
    return;
  }
  uVar9 = CONCAT71(in_register_00000011,type) & 0xffffffff;
  pEStack_40 = (ExtensionSet *)0x25a856;
  pVar10 = Insert(this,number);
  pEVar4 = pVar10.first;
  pEVar4->descriptor = descriptor;
  if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar4->is_repeated != false) goto LAB_0025a92c;
    if ((byte)(pEVar4->type - 0x13) < 0xee) goto LAB_0025a93c;
    this_02 = (ExtensionSet *)
              (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar4->type * 4);
    if (*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar4->type * 4) == 10) {
      if ((pEVar4->field_0xa & 4) != 0) {
        pEStack_40 = (ExtensionSet *)0x25a911;
        (**(code **)(**(long **)&(pEVar4->field_0).int32_t_value + 0x38))
                  (*(long **)&(pEVar4->field_0).int32_t_value,message,this->arena_);
        goto LAB_0025a911;
      }
      if ((this->arena_ == (Arena *)0x0) && ((long *)(pEVar4->field_0).int64_t_value != (long *)0x0)
         ) {
        pEStack_40 = (ExtensionSet *)0x25a8fd;
        (**(code **)(*(long *)(pEVar4->field_0).int64_t_value + 8))();
      }
      goto LAB_0025a8fd;
    }
  }
  else {
    pEVar4->type = (FieldType)uVar9;
    if ((byte)(type - 0x13) < 0xee) {
      pEStack_40 = (ExtensionSet *)0x25a92c;
      UnsafeArenaSetAllocatedMessage((ExtensionSet *)auStack_38);
LAB_0025a92c:
      pEStack_40 = (ExtensionSet *)0x25a934;
      UnsafeArenaSetAllocatedMessage((ExtensionSet *)auStack_38);
    }
    else if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) == 10) {
      pEVar4->is_repeated = false;
      pEVar4->field_0xa = (pEVar4->field_0xa & 0xfa) + 1;
LAB_0025a8fd:
      pEVar4->field_0 = (anon_union_8_9_fdc4a54a_for_Extension_0)message;
LAB_0025a911:
      pEVar4->field_0xa = pEVar4->field_0xa & 0xfd;
      return;
    }
    pEStack_40 = (ExtensionSet *)0x25a93c;
    UnsafeArenaSetAllocatedMessage();
LAB_0025a93c:
    pEStack_40 = (ExtensionSet *)0x25a944;
    UnsafeArenaSetAllocatedMessage((ExtensionSet *)auStack_38);
  }
  pEStack_40 = (ExtensionSet *)ReleaseMessage;
  UnsafeArenaSetAllocatedMessage();
  pEVar8 = &EStack_70;
  uStack_78 = 0x25a966;
  EStack_70.map_ = (AllocatedData)message;
  uStack_58 = uVar9;
  pFStack_50 = descriptor;
  pEStack_48 = pEVar4;
  pEStack_40 = this;
  pEVar4 = FindOrNull(this_02,(int)puVar7);
  if (pEVar4 == (Extension *)0x0) {
    return;
  }
  if (pEVar4->is_repeated == false) {
    if (0xed < (byte)(pEVar4->type - 0x13)) {
      pEVar8 = (ExtensionSet *)
               (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar4->type * 4);
      if (*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar4->type * 4) == 10) {
        pAVar2 = this_02->arena_;
        if ((pEVar4->field_0xa & 4) == 0) {
          if (pAVar2 != (Arena *)0x0) {
            uStack_78 = 0x25a9b8;
            this_01 = MessageLite::New((MessageLite *)pEVar4->field_0,(Arena *)0x0);
            uStack_78 = 0x25a9c6;
            MessageLite::CheckTypeAndMergeFrom(this_01,(MessageLite *)pEVar4->field_0);
          }
        }
        else {
          uStack_78 = 0x25a9dc;
          (**(code **)(**(long **)&(pEVar4->field_0).int32_t_value + 0x40))
                    (*(long **)&(pEVar4->field_0).int32_t_value,extraout_RDX,pAVar2);
          if ((pAVar2 == (Arena *)0x0) && ((long *)(pEVar4->field_0).int64_t_value != (long *)0x0))
          {
            uStack_78 = 0x25a9f2;
            (**(code **)(*(long *)(pEVar4->field_0).int64_t_value + 8))();
          }
        }
        uStack_78 = 0x25a9fc;
        Erase(this_02,(int)puVar7);
        return;
      }
      goto LAB_0025aa1d;
    }
  }
  else {
    uStack_78 = 0x25aa15;
    ReleaseMessage(&EStack_70);
  }
  uStack_78 = 0x25aa1d;
  ReleaseMessage(&EStack_70);
LAB_0025aa1d:
  uStack_78 = 0x25aa25;
  iStack_7c = (int)&EStack_70;
  ReleaseMessage();
  sVar3 = *(short *)((long)pEVar8 + 10);
  this_00 = *(btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
              **)((long)pEVar8 + 0x10);
  uStack_78 = (ulong)puVar7 & 0xffffffff;
  if ((long)sVar3 < 0) {
    absl::lts_20240722::container_internal::
    btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_>
    ::erase<int>(this_00,&iStack_7c);
  }
  else if (sVar3 != 0) {
    lVar6 = (long)sVar3 * 0x20;
    lVar5 = 0;
    do {
      iVar1 = *(int *)((long)&(this_00->tree_).root_ + lVar5);
      if (iVar1 != iStack_7c && iStack_7c <= iVar1) {
        return;
      }
      if (iVar1 == iStack_7c) {
        if (lVar6 + -0x20 != lVar5) {
          memmove((void *)((long)&(this_00->tree_).root_ + lVar5),
                  (void *)((long)&this_00[1].tree_.rightmost_.
                                  super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::key_compare_adapter<std::less<int>,_int>::checked_compare,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                                  .
                                  super_Storage<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>_*,_2UL,_false>
                                  .value + lVar5),(lVar6 - lVar5) - 0x20);
          sVar3 = *(short *)((long)pEVar8 + 10);
        }
        *(short *)((long)pEVar8 + 10) = sVar3 + -1;
        return;
      }
      lVar5 = lVar5 + 0x20;
    } while (lVar6 != lVar5);
  }
  return;
}

Assistant:

void ExtensionSet::UnsafeArenaSetAllocatedMessage(
    int number, FieldType type, const FieldDescriptor* descriptor,
    MessageLite* message) {
  if (message == nullptr) {
    ClearExtension(number);
    return;
  }
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_pointer = true;
    extension->is_lazy = false;
    extension->ptr.message_value = message;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    if (extension->is_lazy) {
      extension->ptr.lazymessage_value->UnsafeArenaSetAllocatedMessage(message,
                                                                       arena_);
    } else {
      if (arena_ == nullptr) {
        delete extension->ptr.message_value;
      }
      extension->ptr.message_value = message;
    }
  }
  extension->is_cleared = false;
}